

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O1

int fct_clp__init(fct_clp_t *clp,fctcl_init_t *options)

{
  int iVar1;
  int extraout_EAX;
  void **ppvVar2;
  
  if (clp == (fct_clp_t *)0x0) {
    __assert_fail("clp != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x638
                  ,"int fct_clp__init(fct_clp_t *, const fctcl_init_t *)");
  }
  ppvVar2 = (void **)malloc(0x40);
  (clp->clo_list).itm_list = ppvVar2;
  if (ppvVar2 != (void **)0x0) {
    (clp->clo_list).avail_itm_num = 8;
    (clp->clo_list).used_itm_num = 0;
    if (options != (fctcl_init_t *)0x0) {
      iVar1 = fct_clp__add_options(clp,options);
      if (iVar1 == 0) goto LAB_001050ab;
    }
    ppvVar2 = (void **)malloc(0x40);
    (clp->param_list).itm_list = ppvVar2;
    if (ppvVar2 != (void **)0x0) {
      (clp->param_list).avail_itm_num = 8;
      (clp->param_list).used_itm_num = 0;
      return (int)ppvVar2;
    }
  }
LAB_001050ab:
  fct_clp__final(clp);
  return extraout_EAX;
}

Assistant:

static int
fct_clp__init(fct_clp_t *clp, fctcl_init_t const *options)
{
    int ok =0;
    FCT_ASSERT( clp != NULL );
    /* It is just much saner to manage a clone of the options. Then we know
    who is in charge of the memory. */
    ok = fct_nlist__init(&(clp->clo_list));
    if ( !ok )
    {
        goto finally;
    }
    if ( options != NULL )
    {
        ok = fct_clp__add_options(clp, options);
        if ( !ok )
        {
            goto finally;
        }
    }
    ok = fct_nlist__init(&(clp->param_list));
    if ( !ok )
    {
        goto finally;
    }
    ok =1;
finally:
    if ( !ok )
    {
        fct_clp__final(clp);
    }
    return ok;
}